

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

EventLoop * kj::anon_unknown_54::currentEventLoop(void)

{
  long in_FS_OFFSET;
  Fault f;
  Fault local_10;
  
  if (*(EventLoop **)(in_FS_OFFSET + -0x10) != (EventLoop *)0x0) {
    return *(EventLoop **)(in_FS_OFFSET + -0x10);
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
             ,0x33,FAILED,"loop != nullptr","\"No event loop is running on this thread.\"",
             (char (*) [41])"No event loop is running on this thread.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

EventLoop& currentEventLoop() {
  EventLoop* loop = threadLocalEventLoop;
  KJ_REQUIRE(loop != nullptr, "No event loop is running on this thread.");
  return *loop;
}